

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<kj::Repeat<char>,char_const*&,char,int&,char_const(&)[3],kj::String>
          (String *__return_storage_ptr__,kj *this,Repeat<char> *params,char **params_1,
          char *params_2,int *params_3,char (*params_4) [3],String *params_5)

{
  Repeat<char> *value;
  char **value_00;
  char *value_01;
  kj *this_00;
  char (*value_02) [3];
  String *value_03;
  int *value_04;
  Repeat<char> RVar1;
  ArrayPtr<const_char> *in_stack_ffffffffffffff50;
  ArrayPtr<const_char> local_98;
  ArrayPtr<const_char> local_88;
  CappedArray<char,_14UL> local_78;
  char local_59 [1];
  ArrayPtr<const_char> local_58;
  _ local_48 [8];
  size_t local_40;
  char (*local_38) [3];
  char (*params_local_4) [3];
  int *params_local_3;
  char *params_local_2;
  char **params_local_1;
  Repeat<char> *params_local;
  
  local_38 = (char (*) [3])params_3;
  params_local_4 = (char (*) [3])params_2;
  params_local_3 = (int *)params_1;
  params_local_2 = &params->value;
  params_local_1 = (char **)this;
  params_local = (Repeat<char> *)__return_storage_ptr__;
  value = fwd<kj::Repeat<char>>((NoInfer<kj::Repeat<char>_> *)this);
  RVar1 = toCharSequence<kj::Repeat<char>>(value);
  local_40 = RVar1.count;
  local_48[0] = (_)RVar1.value;
  value_00 = fwd<char_const*&>((char **)params_local_2);
  local_58 = toCharSequence<char_const*&>(value_00);
  value_01 = fwd<char>((NoInfer<char> *)params_local_3);
  local_59[0] = (char)toCharSequence<char>(value_01);
  this_00 = (kj *)fwd<int&>((int *)params_local_4);
  toCharSequence<int&>(&local_78,this_00,value_04);
  value_02 = ::const(local_38);
  local_88 = toCharSequence<char_const(&)[3]>(value_02);
  value_03 = fwd<kj::String>((NoInfer<kj::String> *)params_4);
  local_98 = toCharSequence<kj::String>(value_03);
  _::
  concat<kj::Repeat<char>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,local_48,(Repeat<char> *)&local_58,
             (ArrayPtr<const_char> *)local_59,(FixedArray<char,_1UL> *)&local_78,
             (CappedArray<char,_14UL> *)&local_88,&local_98,in_stack_ffffffffffffff50);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}